

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source-map.h
# Opt level: O2

char __thiscall wasm::SourceMapReader::peek(SourceMapReader *this)

{
  ulong uVar1;
  ulong uVar2;
  char cVar3;
  string *this_00;
  string local_48 [39];
  allocator<char> local_21;
  
  uVar1 = this->pos;
  cVar3 = '\"';
  uVar2 = (this->mappings)._M_len;
  if (uVar1 != uVar2) {
    if (uVar2 < uVar1) {
      this_00 = (string *)__cxa_allocate_exception(0x20);
      std::__cxx11::string::string<std::allocator<char>>
                (local_48,"unexpected end of source map",&local_21);
      std::__cxx11::string::string(this_00,local_48);
      __cxa_throw(this_00,&MapParseException::typeinfo,MapParseException::~MapParseException);
    }
    cVar3 = (this->mappings)._M_str[uVar1];
  }
  return cVar3;
}

Assistant:

char peek() {
    if (pos == mappings.size()) {
      return '"';
    } else if (pos > mappings.size()) {
      throw MapParseException("unexpected end of source map");
    }
    return mappings[pos];
  }